

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableStringOneofFieldLiteGenerator::GenerateMembers
          (ImmutableStringOneofFieldLiteGenerator *this,Printer *printer)

{
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  FieldDescriptor *pFVar1;
  Context *pCVar2;
  pointer pcVar3;
  bool bVar4;
  MessageLite *pMVar5;
  undefined8 extraout_RAX;
  string_view begin_varname;
  string_view begin_varname_00;
  string_view begin_varname_01;
  string_view begin_varname_02;
  string_view begin_varname_03;
  string_view begin_varname_04;
  string_view end_varname;
  string_view end_varname_00;
  string_view end_varname_01;
  string_view end_varname_02;
  string_view end_varname_03;
  string_view end_varname_04;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view text_06;
  undefined1 local_220 [8];
  _Alloc_hider local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  _Alloc_hider local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  undefined2 local_1d8;
  undefined1 local_1d0 [8];
  _Alloc_hider local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  _Alloc_hider local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  undefined2 local_188;
  undefined1 local_180 [8];
  _Alloc_hider local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  _Alloc_hider local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  undefined2 local_138;
  undefined1 local_130 [8];
  _Alloc_hider local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  _Alloc_hider local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  undefined2 local_e8;
  undefined1 local_e0 [8];
  _Alloc_hider local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  _Alloc_hider local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  undefined2 local_98;
  undefined1 local_90 [8];
  _Alloc_hider local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  _Alloc_hider local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58 [2];
  
  variables = &(this->super_ImmutableStringFieldLiteGenerator).variables_;
  PrintExtraFieldInfo(variables,printer);
  bVar4 = FieldDescriptor::has_presence((this->super_ImmutableStringFieldLiteGenerator).descriptor_)
  ;
  if (bVar4) {
    pFVar1 = (this->super_ImmutableStringFieldLiteGenerator).descriptor_;
    pCVar2 = (this->super_ImmutableStringFieldLiteGenerator).context_;
    local_90[4] = (pCVar2->options_).opensource_runtime;
    local_90[5] = (pCVar2->options_).annotate_code;
    local_90[0] = (pCVar2->options_).generate_immutable_code;
    local_90[1] = (pCVar2->options_).generate_mutable_code;
    local_90[2] = (pCVar2->options_).generate_shared_code;
    local_90[3] = (pCVar2->options_).enforce_lite;
    pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
    local_88._M_p = (pointer)&local_78;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,pcVar3,
               pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
    pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
    local_68._M_p = (pointer)local_58;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar3,
               pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
    local_58[1]._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
    local_58[1]._1_1_ = (pCVar2->options_).jvm_dsl;
    WriteFieldAccessorDocComment(printer,pFVar1,HAZZER,(Options *)local_90,false,false,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_p != local_58) {
      operator_delete(local_68._M_p,local_58[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_p != &local_78) {
      operator_delete(local_88._M_p,local_78._M_allocated_capacity + 1);
    }
    text._M_str = 
    "@java.lang.Override\n$deprecation$public boolean ${$has$capitalized_name$$}$() {\n  return $has_oneof_case_message$;\n}\n"
    ;
    text._M_len = 0x75;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,variables,text);
    begin_varname._M_str = "{";
    begin_varname._M_len = 1;
    end_varname._M_str = "}";
    end_varname._M_len = 1;
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,begin_varname,end_varname,
               (this->super_ImmutableStringFieldLiteGenerator).descriptor_,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    pFVar1 = (this->super_ImmutableStringFieldLiteGenerator).descriptor_;
    pCVar2 = (this->super_ImmutableStringFieldLiteGenerator).context_;
    local_e0[4] = (pCVar2->options_).opensource_runtime;
    local_e0[5] = (pCVar2->options_).annotate_code;
    local_e0[0] = (pCVar2->options_).generate_immutable_code;
    local_e0[1] = (pCVar2->options_).generate_mutable_code;
    local_e0[2] = (pCVar2->options_).generate_shared_code;
    local_e0[3] = (pCVar2->options_).enforce_lite;
    pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
    local_d8._M_p = (pointer)&local_c8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d8,pcVar3,
               pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
    pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
    local_b8._M_p = (pointer)&local_a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,pcVar3,
               pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
    local_98._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
    local_98._1_1_ = (pCVar2->options_).jvm_dsl;
    WriteFieldAccessorDocComment(printer,pFVar1,GETTER,(Options *)local_e0,false,false,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_p != &local_a8) {
      operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_p != &local_c8) {
      operator_delete(local_d8._M_p,local_c8._M_allocated_capacity + 1);
    }
    text_00._M_str =
         "@java.lang.Override\n$deprecation$public java.lang.String ${$get$capitalized_name$$}$() {\n  java.lang.String ref $default_init$;\n  if ($has_oneof_case_message$) {\n    ref = (java.lang.String) $oneof_name$_;\n  }\n  return ref;\n}\n"
    ;
    text_00._M_len = 0xe2;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,variables,text_00);
    begin_varname_00._M_str = "{";
    begin_varname_00._M_len = 1;
    end_varname_00._M_str = "}";
    end_varname_00._M_len = 1;
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,begin_varname_00,end_varname_00,
               (this->super_ImmutableStringFieldLiteGenerator).descriptor_,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    pFVar1 = (this->super_ImmutableStringFieldLiteGenerator).descriptor_;
    pCVar2 = (this->super_ImmutableStringFieldLiteGenerator).context_;
    local_130[4] = (pCVar2->options_).opensource_runtime;
    local_130[5] = (pCVar2->options_).annotate_code;
    local_130[0] = (pCVar2->options_).generate_immutable_code;
    local_130[1] = (pCVar2->options_).generate_mutable_code;
    local_130[2] = (pCVar2->options_).generate_shared_code;
    local_130[3] = (pCVar2->options_).enforce_lite;
    pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
    local_128._M_p = (pointer)&local_118;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_128,pcVar3,
               pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
    pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
    local_108._M_p = (pointer)&local_f8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_108,pcVar3,
               pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
    local_e8._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
    local_e8._1_1_ = (pCVar2->options_).jvm_dsl;
    WriteFieldStringBytesAccessorDocComment
              (printer,pFVar1,GETTER,(Options *)local_130,false,false,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_p != &local_f8) {
      operator_delete(local_108._M_p,local_f8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_p != &local_118) {
      operator_delete(local_128._M_p,local_118._M_allocated_capacity + 1);
    }
    text_01._M_str =
         "@java.lang.Override\n$deprecation$public com.google.protobuf.ByteString\n    ${$get$capitalized_name$Bytes$}$() {\n  java.lang.String ref $default_init$;\n  if ($has_oneof_case_message$) {\n    ref = (java.lang.String) $oneof_name$_;\n  }\n  return com.google.protobuf.ByteString.copyFromUtf8(ref);\n}\n"
    ;
    text_01._M_len = 0x126;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,variables,text_01);
    begin_varname_01._M_str = "{";
    begin_varname_01._M_len = 1;
    end_varname_01._M_str = "}";
    end_varname_01._M_len = 1;
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,begin_varname_01,end_varname_01,
               (this->super_ImmutableStringFieldLiteGenerator).descriptor_,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    pFVar1 = (this->super_ImmutableStringFieldLiteGenerator).descriptor_;
    pCVar2 = (this->super_ImmutableStringFieldLiteGenerator).context_;
    local_180[4] = (pCVar2->options_).opensource_runtime;
    local_180[5] = (pCVar2->options_).annotate_code;
    local_180[0] = (pCVar2->options_).generate_immutable_code;
    local_180[1] = (pCVar2->options_).generate_mutable_code;
    local_180[2] = (pCVar2->options_).generate_shared_code;
    local_180[3] = (pCVar2->options_).enforce_lite;
    pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
    local_178._M_p = (pointer)&local_168;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_178,pcVar3,
               pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
    pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
    local_158._M_p = (pointer)&local_148;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_158,pcVar3,
               pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
    local_138._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
    local_138._1_1_ = (pCVar2->options_).jvm_dsl;
    WriteFieldAccessorDocComment(printer,pFVar1,SETTER,(Options *)local_180,false,false,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_p != &local_148) {
      operator_delete(local_158._M_p,local_148._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_p != &local_168) {
      operator_delete(local_178._M_p,local_168._M_allocated_capacity + 1);
    }
    text_02._M_str =
         "@java.lang.SuppressWarnings(\"ReturnValueIgnored\")\nprivate void ${$set$capitalized_name$$}$(\n    java.lang.String value) {\n  value.getClass();  // minimal bytecode null check\n  $set_oneof_case_message$;\n  $oneof_name$_ = value;\n}\n"
    ;
    text_02._M_len = 0xe5;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,variables,text_02);
    begin_varname_02._M_str = "{";
    begin_varname_02._M_len = 1;
    end_varname_02._M_str = "}";
    end_varname_02._M_len = 1;
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,begin_varname_02,end_varname_02,
               (this->super_ImmutableStringFieldLiteGenerator).descriptor_,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x100000001);
    pFVar1 = (this->super_ImmutableStringFieldLiteGenerator).descriptor_;
    pCVar2 = (this->super_ImmutableStringFieldLiteGenerator).context_;
    local_1d0[4] = (pCVar2->options_).opensource_runtime;
    local_1d0[5] = (pCVar2->options_).annotate_code;
    local_1d0[0] = (pCVar2->options_).generate_immutable_code;
    local_1d0[1] = (pCVar2->options_).generate_mutable_code;
    local_1d0[2] = (pCVar2->options_).generate_shared_code;
    local_1d0[3] = (pCVar2->options_).enforce_lite;
    pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
    local_1c8._M_p = (pointer)&local_1b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c8,pcVar3,
               pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
    pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
    local_1a8._M_p = (pointer)&local_198;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1a8,pcVar3,
               pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
    local_188._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
    local_188._1_1_ = (pCVar2->options_).jvm_dsl;
    WriteFieldAccessorDocComment(printer,pFVar1,CLEARER,(Options *)local_1d0,false,false,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_p != &local_198) {
      operator_delete(local_1a8._M_p,local_198._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_p != &local_1b8) {
      operator_delete(local_1c8._M_p,local_1b8._M_allocated_capacity + 1);
    }
    text_03._M_str =
         "private void ${$clear$capitalized_name$$}$() {\n  if ($has_oneof_case_message$) {\n    $clear_oneof_case_message$;\n    $oneof_name$_ = null;\n  }\n}\n"
    ;
    text_03._M_len = 0x91;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,variables,text_03);
    begin_varname_03._M_str = "{";
    begin_varname_03._M_len = 1;
    end_varname_03._M_str = "}";
    end_varname_03._M_len = 1;
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,begin_varname_03,end_varname_03,
               (this->super_ImmutableStringFieldLiteGenerator).descriptor_,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x100000001);
    pFVar1 = (this->super_ImmutableStringFieldLiteGenerator).descriptor_;
    pCVar2 = (this->super_ImmutableStringFieldLiteGenerator).context_;
    local_220[4] = (pCVar2->options_).opensource_runtime;
    local_220[5] = (pCVar2->options_).annotate_code;
    local_220[0] = (pCVar2->options_).generate_immutable_code;
    local_220[1] = (pCVar2->options_).generate_mutable_code;
    local_220[2] = (pCVar2->options_).generate_shared_code;
    local_220[3] = (pCVar2->options_).enforce_lite;
    pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
    local_218._M_p = (pointer)&local_208;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_218,pcVar3,
               pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
    pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
    local_1f8._M_p = (pointer)&local_1e8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f8,pcVar3,
               pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
    local_1d8._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
    local_1d8._1_1_ = (pCVar2->options_).jvm_dsl;
    WriteFieldStringBytesAccessorDocComment
              (printer,pFVar1,SETTER,(Options *)local_220,false,false,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_p != &local_1e8) {
      operator_delete(local_1f8._M_p,local_1e8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_p != &local_208) {
      operator_delete(local_218._M_p,local_208._M_allocated_capacity + 1);
    }
    text_04._M_str =
         "private void ${$set$capitalized_name$Bytes$}$(\n    com.google.protobuf.ByteString value) {\n"
    ;
    text_04._M_len = 0x5b;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,variables,text_04);
    begin_varname_04._M_str = "{";
    begin_varname_04._M_len = 1;
    end_varname_04._M_str = "}";
    end_varname_04._M_len = 1;
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,begin_varname_04,end_varname_04,
               (this->super_ImmutableStringFieldLiteGenerator).descriptor_,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x100000001);
    pFVar1 = (this->super_ImmutableStringFieldLiteGenerator).descriptor_;
    pMVar5 = protobuf::internal::ExtensionSet::GetMessage
                       (&(pFVar1->merged_features_->field_0)._impl_._extensions_,pb::java,
                        (MessageLite *)PTR__JavaFeatures_default_instance__019e6258);
    if ((((int)pMVar5[1]._internal_metadata_.ptr_ == 2) ||
        ((pFVar1->merged_features_->field_0)._impl_.utf8_validation_ == 2)) ||
       ((pFVar1->file_->options_->field_0)._impl_.java_string_check_utf8_ == true)) {
      text_05._M_str = "  checkByteStringIsUtf8(value);\n";
      text_05._M_len = 0x20;
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (printer,variables,text_05);
    }
    text_06._M_str = "  $oneof_name$_ = value.toStringUtf8();\n  $set_oneof_case_message$;\n}\n";
    text_06._M_len = 0x46;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,variables,text_06);
    return;
  }
  GenerateMembers();
  Options::~Options((Options *)local_220);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void ImmutableStringOneofFieldLiteGenerator::GenerateMembers(
    io::Printer* printer) const {
  PrintExtraFieldInfo(variables_, printer);
  ABSL_DCHECK(descriptor_->has_presence());
  WriteFieldAccessorDocComment(printer, descriptor_, HAZZER,
                               context_->options());
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public boolean ${$has$capitalized_name$$}$() {\n"
                 "  return $has_oneof_case_message$;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  WriteFieldAccessorDocComment(printer, descriptor_, GETTER,
                               context_->options());
  printer->Print(
      variables_,
      "@java.lang.Override\n"
      "$deprecation$public java.lang.String ${$get$capitalized_name$$}$() {\n"
      "  java.lang.String ref $default_init$;\n"
      "  if ($has_oneof_case_message$) {\n"
      "    ref = (java.lang.String) $oneof_name$_;\n"
      "  }\n"
      "  return ref;\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);

  WriteFieldStringBytesAccessorDocComment(printer, descriptor_, GETTER,
                                          context_->options());
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public com.google.protobuf.ByteString\n"
                 "    ${$get$capitalized_name$Bytes$}$() {\n"
                 "  java.lang.String ref $default_init$;\n"
                 "  if ($has_oneof_case_message$) {\n"
                 "    ref = (java.lang.String) $oneof_name$_;\n"
                 "  }\n"
                 "  return com.google.protobuf.ByteString.copyFromUtf8(ref);\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  WriteFieldAccessorDocComment(printer, descriptor_, SETTER,
                               context_->options(), /* builder */ false,
                               /* kdoc */ false, /* is_private */ true);
  printer->Print(variables_,
                 "@java.lang.SuppressWarnings(\"ReturnValueIgnored\")\n"
                 "private void ${$set$capitalized_name$$}$(\n"
                 "    java.lang.String value) {\n"
                 "  value.getClass();  // minimal bytecode null check\n"
                 "  $set_oneof_case_message$;\n"
                 "  $oneof_name$_ = value;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);
  WriteFieldAccessorDocComment(printer, descriptor_, CLEARER,
                               context_->options(), /* builder */ false,
                               /* kdoc */ false, /* is_private */ true);
  printer->Print(variables_,
                 "private void ${$clear$capitalized_name$$}$() {\n"
                 "  if ($has_oneof_case_message$) {\n"
                 "    $clear_oneof_case_message$;\n"
                 "    $oneof_name$_ = null;\n"
                 "  }\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);

  WriteFieldStringBytesAccessorDocComment(
      printer, descriptor_, SETTER, context_->options(), /* builder */ false,
      /* kdoc */ false, /* is_private */ true);
  printer->Print(variables_,
                 "private void ${$set$capitalized_name$Bytes$}$(\n"
                 "    com.google.protobuf.ByteString value) {\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);
  if (CheckUtf8(descriptor_)) {
    printer->Print(variables_, "  checkByteStringIsUtf8(value);\n");
  }
  printer->Print(variables_,
                 "  $oneof_name$_ = value.toStringUtf8();\n"
                 "  $set_oneof_case_message$;\n"
                 "}\n");
}